

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Material.cpp
# Opt level: O0

bool __thiscall
Isotropic::Scatter(Isotropic *this,Ray *ray_in,hit_record_t *hit_record,Vec3 *attenuation,
                  Ray *ray_out)

{
  long *plVar1;
  undefined8 *in_RCX;
  long in_RDX;
  Ray *in_RSI;
  Ray *in_RDI;
  undefined8 *in_R8;
  float local_68;
  float in_stack_ffffffffffffff9c;
  float in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  Vec3 *in_stack_ffffffffffffffa8;
  Ray *in_stack_ffffffffffffffb0;
  undefined8 local_44;
  undefined8 local_3c;
  undefined8 local_34;
  undefined4 local_2c;
  
  random_in_unit_disk();
  Ray::GetTime(in_RSI);
  Ray::Ray(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
           (Vec3 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
           in_stack_ffffffffffffff9c);
  *in_R8 = local_44;
  in_R8[1] = local_3c;
  in_R8[2] = local_34;
  *(undefined4 *)(in_R8 + 3) = local_2c;
  Ray::~Ray(in_RDI);
  Vec3::~Vec3((Vec3 *)&stack0xffffffffffffffb0);
  plVar1 = *(long **)((in_RDI->m_origin).e + 2);
  (**(code **)(*plVar1 + 0x10))
            (*(undefined4 *)(in_RDX + 4),*(undefined4 *)(in_RDX + 8),&local_68,plVar1,in_RDX + 0xc);
  *in_RCX = CONCAT44(in_stack_ffffffffffffff9c,local_68);
  *(float *)(in_RCX + 1) = in_stack_ffffffffffffffa0;
  Vec3::~Vec3((Vec3 *)&local_68);
  return true;
}

Assistant:

bool
Isotropic::Scatter(const Ray& ray_in, hit_record_t& hit_record, Vec3& attenuation, Ray& ray_out) const
{
	ray_out		= Ray(hit_record.m_point, random_in_unit_disk(), ray_in.GetTime());
	attenuation = m_albedo->GetValue(hit_record.m_u, hit_record.m_v, hit_record.m_point);

	return true;
}